

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# struct_column_data.cpp
# Opt level: O2

void __thiscall duckdb::StructColumnData::SetStart(StructColumnData *this,idx_t new_start)

{
  pointer puVar1;
  pointer pCVar2;
  unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *sub_column;
  pointer this_00;
  
  (this->super_ColumnData).start = new_start;
  puVar1 = (this->sub_columns).
           super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->sub_columns).
                 super_vector<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                 .
                 super__Vector_base<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != puVar1; this_00 = this_00 + 1
      ) {
    pCVar2 = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::
             operator->(this_00);
    (*pCVar2->_vptr_ColumnData[4])(pCVar2,new_start);
  }
  ColumnData::SetStart(&(this->validity).super_ColumnData,new_start);
  return;
}

Assistant:

void StructColumnData::SetStart(idx_t new_start) {
	this->start = new_start;
	for (auto &sub_column : sub_columns) {
		sub_column->SetStart(new_start);
	}
	validity.SetStart(new_start);
}